

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::Action
          (Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *this,
          ActionInterface<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
          *impl)

{
  ActionAdapter local_28;
  ActionInterface<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
  *local_18;
  ActionInterface<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
  *impl_local;
  Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                *)this;
  std::
  shared_ptr<testing::ActionInterface<ot::commissioner::EnergyReport_const*(ot::commissioner::Address_const&)>>
  ::
  shared_ptr<testing::ActionInterface<ot::commissioner::EnergyReport_const*(ot::commissioner::Address_const&)>,void>
            ((shared_ptr<testing::ActionInterface<ot::commissioner::EnergyReport_const*(ot::commissioner::Address_const&)>>
              *)&local_28,impl);
  std::function<ot::commissioner::EnergyReport_const*(ot::commissioner::Address_const&)>::
  function<testing::Action<ot::commissioner::EnergyReport_const*(ot::commissioner::Address_const&)>::ActionAdapter,void>
            ((function<ot::commissioner::EnergyReport_const*(ot::commissioner::Address_const&)> *)
             this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}